

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IndexedByLookup(Parse *pParse,SrcList_item *pFrom)

{
  char *zRight;
  Index *pIVar1;
  int iVar2;
  Index **ppIVar3;
  
  iVar2 = 0;
  if ((pFrom->pTab != (Table *)0x0) && (((pFrom->fg).field_0x1 & 2) != 0)) {
    zRight = (pFrom->u1).zIndexedBy;
    ppIVar3 = &pFrom->pTab->pIndex;
    while (pIVar1 = *ppIVar3, pIVar1 != (Index *)0x0) {
      iVar2 = sqlite3StrICmp(pIVar1->zName,zRight);
      if (iVar2 == 0) {
        pFrom->pIBIndex = pIVar1;
        return 0;
      }
      ppIVar3 = &pIVar1->pNext;
    }
    sqlite3ErrorMsg(pParse,"no such index: %s",zRight,0);
    pParse->checkSchema = '\x01';
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexedByLookup(Parse *pParse, struct SrcList_item *pFrom){
  if( pFrom->pTab && pFrom->fg.isIndexedBy ){
    Table *pTab = pFrom->pTab;
    char *zIndexedBy = pFrom->u1.zIndexedBy;
    Index *pIdx;
    for(pIdx=pTab->pIndex; 
        pIdx && sqlite3StrICmp(pIdx->zName, zIndexedBy); 
        pIdx=pIdx->pNext
    );
    if( !pIdx ){
      sqlite3ErrorMsg(pParse, "no such index: %s", zIndexedBy, 0);
      pParse->checkSchema = 1;
      return SQLITE_ERROR;
    }
    pFrom->pIBIndex = pIdx;
  }
  return SQLITE_OK;
}